

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint64 tag,char *ptr,Message *containing_type,
          InternalMetadataWithArena *metadata,ParseContext *ctx)

{
  DescriptorPool *pDVar1;
  MessageFactory *pMVar2;
  ParseContext *ctx_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  uint wire_type;
  int field_number;
  UnknownFieldSet *unknown;
  bool was_packed_on_wire;
  GeneratedExtensionFinder finder;
  ExtensionInfo extension;
  bool local_89;
  ParseContext *local_88;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *local_80;
  char *local_78;
  ExtensionFinder local_70;
  DescriptorPool *local_68;
  MessageFactory *local_60;
  undefined8 local_58;
  ExtensionInfo local_50;
  
  wire_type = (uint)tag & 7;
  pDVar1 = (ctx->data_).pool;
  field_number = (int)(tag >> 3);
  local_88 = ctx;
  local_80 = &metadata->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  ;
  if (pDVar1 == (DescriptorPool *)0x0) {
    local_70._vptr_ExtensionFinder = (_func_int **)&PTR__ExtensionFinder_00677a80;
    local_68 = (DescriptorPool *)containing_type;
    bVar3 = FindExtensionInfoFromFieldNumber
                      (this,wire_type,field_number,&local_70,&local_50,&local_89);
    ExtensionFinder::~ExtensionFinder(&local_70);
    ctx_00 = local_88;
  }
  else {
    pMVar2 = (ctx->data_).factory;
    local_78 = ptr;
    iVar4 = (*(containing_type->super_MessageLite)._vptr_MessageLite[0x15])(containing_type);
    local_58 = CONCAT44(extraout_var,iVar4);
    local_70._vptr_ExtensionFinder = (_func_int **)&PTR__ExtensionFinder_00679cd0;
    local_68 = pDVar1;
    local_60 = pMVar2;
    bVar3 = FindExtensionInfoFromFieldNumber
                      (this,wire_type,field_number,&local_70,&local_50,&local_89);
    ExtensionFinder::~ExtensionFinder(&local_70);
    ptr = local_78;
    ctx_00 = local_88;
  }
  local_88 = ctx_00;
  if (bVar3) {
    pcVar5 = ParseFieldWithExtensionInfo<google::protobuf::internal::InternalMetadataWithArena>
                       (this,field_number,local_89,&local_50,(InternalMetadataWithArena *)local_80,
                        ptr,ctx_00);
  }
  else {
    if (((ulong)local_80->ptr_ & 1) == 0) {
      unknown = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow(local_80);
    }
    else {
      unknown = (UnknownFieldSet *)((ulong)local_80->ptr_ & 0xfffffffffffffffe);
    }
    pcVar5 = UnknownFieldParse(tag,unknown,ptr,ctx_00);
  }
  return pcVar5;
}

Assistant:

const char* ExtensionSet::ParseField(
    uint64 tag, const char* ptr, const Message* containing_type,
    internal::InternalMetadataWithArena* metadata,
    internal::ParseContext* ctx) {
  int number = tag >> 3;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtension(tag & 7, number, containing_type, ctx, &extension,
                     &was_packed_on_wire)) {
    return UnknownFieldParse(tag, metadata->mutable_unknown_fields(), ptr, ctx);
  }
  return ParseFieldWithExtensionInfo(number, was_packed_on_wire, extension,
                                     metadata, ptr, ctx);
}